

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O2

char * TMS320C64x_group_name(csh handle,uint id)

{
  long lVar1;
  long lVar2;
  
  if (0x84 < id) {
    return (char *)0x0;
  }
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x80) {
      lVar2 = (ulong)id * 0x10;
      break;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(uint *)((long)&group_name_maps[0].id + lVar2) != id);
  return *(char **)((long)&group_name_maps[0].name + lVar2);
}

Assistant:

const char *TMS320C64x_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= TMS320C64X_GRP_ENDING)
		return NULL;

	for (i = 0; i < ARR_SIZE(group_name_maps); i++) {
		if (group_name_maps[i].id == id)
			return group_name_maps[i].name;
	}

	return group_name_maps[id].name;
#else
	return NULL;
#endif
}